

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::EnumValueDescriptorProto::MergePartialFromCodedStream
          (EnumValueDescriptorProto *this,CodedInputStream *input)

{
  int iVar1;
  uint8 *puVar2;
  bool bVar3;
  uint uVar4;
  Limit limit;
  undefined8 in_RAX;
  string *psVar5;
  EnumValueOptions *pEVar6;
  uint32 tag;
  undefined8 local_38;
  
  local_38 = in_RAX;
LAB_001ec96f:
  do {
    while( true ) {
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (tag = (uint32)(char)*puVar2, -1 < (char)*puVar2)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar2 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0) {
        return true;
      }
      uVar4 = tag >> 3;
      if (uVar4 != 3) break;
      if ((tag & 7) != 2) goto LAB_001eca77;
LAB_001ecada:
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
      if (this->options_ == (EnumValueOptions *)0x0) {
        pEVar6 = (EnumValueOptions *)operator_new(0x60);
        EnumValueOptions::EnumValueOptions(pEVar6);
        this->options_ = pEVar6;
      }
      pEVar6 = this->options_;
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
        local_38 = CONCAT44((int)(char)*puVar2,(uint32)local_38);
        input->buffer_ = puVar2 + 1;
      }
      else {
        bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)((long)&local_38 + 4));
        if (!bVar3) {
          return false;
        }
      }
      iVar1 = input->recursion_depth_;
      input->recursion_depth_ = iVar1 + 1;
      if (input->recursion_limit_ <= iVar1) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,local_38._4_4_);
      bVar3 = EnumValueOptions::MergePartialFromCodedStream(pEVar6,input);
      if (!bVar3) {
        return false;
      }
      if (input->legitimate_message_end_ != true) {
        return false;
      }
      io::CodedInputStream::PopLimit(input,limit);
      if (0 < input->recursion_depth_) {
        input->recursion_depth_ = input->recursion_depth_ + -1;
      }
      if ((input->buffer_ == input->buffer_end_) &&
         ((input->buffer_size_after_limit_ != 0 ||
          (input->total_bytes_read_ == input->current_limit_)))) {
        input->last_tag_ = 0;
        input->legitimate_message_end_ = true;
        return true;
      }
    }
    if (uVar4 == 2) {
      if ((tag & 7) == 0) goto LAB_001eca50;
    }
    else if ((uVar4 == 1) && ((tag & 7) == 2)) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar5 = (string *)operator_new(0x20);
        (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
        psVar5->_M_string_length = 0;
        (psVar5->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar5;
      }
      bVar3 = internal::WireFormatLite::ReadString(input,this->name_);
      if (!bVar3) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (*puVar2 == '\x10')) {
        input->buffer_ = puVar2 + 1;
LAB_001eca50:
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
          local_38 = CONCAT44(local_38._4_4_,(int)(char)*puVar2);
          input->buffer_ = puVar2 + 1;
        }
        else {
          bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)&local_38);
          if (!bVar3) {
            return false;
          }
        }
        this->number_ = (uint32)local_38;
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (*puVar2 == '\x1a')) {
          input->buffer_ = puVar2 + 1;
          goto LAB_001ecada;
        }
      }
      goto LAB_001ec96f;
    }
LAB_001eca77:
    if ((tag & 7) == 4) {
      return true;
    }
    bVar3 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool EnumValueDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_number;
        break;
      }

      // optional int32 number = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_number:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
          set_has_number();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_options;
        break;
      }

      // optional .google.protobuf.EnumValueOptions options = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}